

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hcompress.c
# Opt level: O2

void qtree_reduce(uchar *a,int n,int nx,int ny,uchar *b)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  byte *pbVar11;
  
  iVar1 = n * 2;
  iVar7 = 0;
  iVar10 = 0;
  iVar6 = 0;
  while( true ) {
    lVar4 = (long)iVar7;
    lVar9 = (long)iVar6;
    if (nx + -1 <= iVar10) break;
    lVar5 = lVar4 << 0x20;
    lVar2 = (long)n;
    lVar3 = lVar2 << 0x20;
    pbVar11 = b + lVar9;
    lVar9 = lVar9 << 0x20;
    for (lVar8 = 0; (int)lVar8 < ny + -1; lVar8 = lVar8 + 2) {
      *pbVar11 = (a[lVar8 + lVar4] != '\0') << 3 |
                 (a[lVar8 + lVar4 + 1] != '\0') << 2 |
                 (a[lVar8 + lVar2] != '\0') * '\x02' | a[lVar8 + lVar2 + 1] != '\0';
      lVar5 = lVar5 + 0x200000000;
      lVar3 = lVar3 + 0x200000000;
      lVar9 = lVar9 + 0x100000000;
      iVar6 = iVar6 + 1;
      pbVar11 = pbVar11 + 1;
    }
    if ((int)lVar8 < ny) {
      b[lVar9 >> 0x20] = (a[lVar5 >> 0x20] != '\0') << 3 | (a[lVar3 >> 0x20] != '\0') * '\x02';
      iVar6 = iVar6 + 1;
    }
    iVar10 = iVar10 + 2;
    n = n + iVar1;
    iVar7 = iVar7 + iVar1;
  }
  if (iVar10 < nx) {
    lVar2 = lVar4 << 0x20;
    pbVar11 = b + lVar9;
    lVar9 = lVar9 << 0x20;
    for (lVar3 = 0; (int)lVar3 < ny + -1; lVar3 = lVar3 + 2) {
      *pbVar11 = (a[lVar3 + lVar4] != '\0') << 3 | (a[lVar3 + lVar4 + 1] != '\0') << 2;
      lVar2 = lVar2 + 0x200000000;
      lVar9 = lVar9 + 0x100000000;
      pbVar11 = pbVar11 + 1;
    }
    if ((int)lVar3 < ny) {
      b[lVar9 >> 0x20] = (a[lVar2 >> 0x20] != '\0') << 3;
    }
  }
  return;
}

Assistant:

static void
qtree_reduce(unsigned char a[], int n, int nx, int ny, unsigned char b[])
{
int i, j, k;
int s10, s00;

	k = 0;							/* k is index of b[i/2,j/2]	*/
	for (i = 0; i<nx-1; i += 2) {
		s00 = n*i;					/* s00 is index of a[i,j]	*/
		s10 = s00+n;				/* s10 is index of a[i+1,j]	*/
		for (j = 0; j<ny-1; j += 2) {
			b[k] =	(a[s10+1] != 0)
				| ( (a[s10  ] != 0) << 1)
				| ( (a[s00+1] != 0) << 2)
				| ( (a[s00  ] != 0) << 3);
			k += 1;
			s00 += 2;
			s10 += 2;
		}
		if (j < ny) {
			/*
			 * row size is odd, do last element in row
			 * s00+1,s10+1 are off edge
			 */
			b[k] =  ( (a[s10  ] != 0) << 1)
				  | ( (a[s00  ] != 0) << 3);
			k += 1;
		}
	}
	if (i < nx) {
		/*
		 * column size is odd, do last row
		 * s10,s10+1 are off edge
		 */
		s00 = n*i;
		for (j = 0; j<ny-1; j += 2) {
			b[k] =  ( (a[s00+1] != 0) << 2)
				  | ( (a[s00  ] != 0) << 3);
			k += 1;
			s00 += 2;
		}
		if (j < ny) {
			/*
			 * both row and column size are odd, do corner element
			 * s00+1, s10, s10+1 are off edge
			 */
			b[k] = ( (a[s00  ] != 0) << 3);
			k += 1;
		}
	}
}